

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
PvrLegacyHeader::ToStringArray_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PvrLegacyHeader *this)

{
  pointer ppVar1;
  char *pcVar2;
  __cxx11 local_220 [32];
  PvrLegacyInfo local_200 [38];
  byte local_1da;
  allocator local_1d9;
  string local_1d8 [8];
  string magic_number_string;
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [32];
  __cxx11 local_118 [38];
  byte local_f2;
  allocator local_f1;
  string local_f0 [8];
  string num_surfaces_string;
  __cxx11 local_d0 [32];
  __cxx11 local_b0 [32];
  __cxx11 local_90 [48];
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  string local_58 [8];
  string pixel_format_string;
  uint local_34;
  ImplV2 *pIStack_30;
  uint32_t pixel_format;
  ImplV2 *impl_v2;
  ImplV1 *impl_v1;
  PvrLegacyHeader *local_18;
  PvrLegacyHeader *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  
  impl_v1._7_1_ = 0;
  local_18 = this;
  this_local = (PvrLegacyHeader *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  impl_v2 = (ImplV2 *)&this->impl_v1_;
  pIStack_30 = &this->impl_v2_;
  local_34 = (uint)(byte)(this->impl_v1_).pixel_format_flags;
  local_60._M_node =
       (_Base_ptr)
       std::
       multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)PvrLegacyInfo::pixel_format_names_abi_cxx11_,&local_34);
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_60);
  std::__cxx11::string::string(local_58,(string *)&ppVar1->second);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_58);
  std::__cxx11::to_string(local_90,impl_v2[2].num_surfaces);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::to_string(local_b0,impl_v2->num_surfaces);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::to_string(local_d0,impl_v2->magic_number);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  local_f2 = 0;
  if (pIStack_30->num_surfaces == 0) {
    std::allocator<char>::allocator();
    local_f2 = 1;
    std::__cxx11::string::string(local_f0,"-",&local_f1);
  }
  else {
    std::__cxx11::to_string((__cxx11 *)local_f0,pIStack_30->num_surfaces);
  }
  if ((local_f2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_f0);
  std::__cxx11::to_string(local_118,impl_v2[1].magic_number + 1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  pcVar2 = "True";
  if (impl_v2[3].magic_number == 0) {
    pcVar2 = "False";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,pcVar2,&local_139);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_138);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  pcVar2 = "True";
  if (impl_v2[3].num_surfaces == 0) {
    pcVar2 = "False";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,pcVar2,&local_161);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_160);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  pcVar2 = "True";
  if (impl_v2[4].magic_number == 0) {
    pcVar2 = "False";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,pcVar2,&local_189);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_188);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  pcVar2 = "True";
  if (impl_v2[4].num_surfaces == 0) {
    pcVar2 = "False";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,pcVar2,&local_1b1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  local_1da = 0;
  if (pIStack_30->magic_number == 0) {
    std::allocator<char>::allocator();
    local_1da = 1;
    std::__cxx11::string::string(local_1d8,"-",&local_1d9);
  }
  else {
    std::__cxx11::to_string((__cxx11 *)local_1d8,pIStack_30->magic_number);
  }
  if ((local_1da & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_1d8);
  PvrLegacyInfo::PrintFlagNames_abi_cxx11_(local_200,impl_v2[1].num_surfaces);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_200);
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::to_string(local_220,impl_v2[2].magic_number);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_220);
  std::__cxx11::string::~string((string *)local_220);
  impl_v1._7_1_ = 1;
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_58);
  if ((impl_v1._7_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> ToStringArray() {
      std::vector<std::string> output;
      const auto& impl_v1(this->impl_v1_);
      const auto& impl_v2(this->impl_v2_);
      const std::uint32_t pixel_format(impl_v1.pixel_format_flags&PvrLegacyInfo::kPixelTypeMask);
      const std::string pixel_format_string(PvrLegacyInfo::pixel_format_names.find(pixel_format)->second);
      output.push_back(pixel_format_string);
      output.push_back(std::to_string(impl_v1.bit_count));
      output.push_back(std::to_string(impl_v1.width));
      output.push_back(std::to_string(impl_v1.height));
      const std::string num_surfaces_string(
        impl_v2.num_surfaces == 0?std::string("-"):std::to_string(impl_v2.num_surfaces));
      output.push_back(num_surfaces_string);
      output.push_back(std::to_string(impl_v1.mip_map_count+1));
      output.push_back(impl_v1.red_mask==0?"False":"True");
      output.push_back(impl_v1.green_mask==0?"False":"True");
      output.push_back(impl_v1.blue_mask==0?"False":"True");
      output.push_back(impl_v1.alpha_mask==0?"False":"True");
      const std::string magic_number_string(
        impl_v2.magic_number == 0?std::string("-"):std::to_string(impl_v2.magic_number));
      output.push_back(magic_number_string);
      output.push_back(PvrLegacyInfo::PrintFlagNames(impl_v1.pixel_format_flags));
      output.push_back(std::to_string(impl_v1.data_size));
      return output;
    }